

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint8_t uVar1;
  long lVar2;
  char *pcVar3;
  
  do {
    uVar1 = calculate();
    if (uVar1 == '\x01') {
      lVar2 = 0xc;
      pcVar3 = "Syntax ERROR";
LAB_001025bc:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
    }
    else if (uVar1 == '\0') {
      lVar2 = 0x13;
      pcVar3 = "Execution completed";
      goto LAB_001025bc;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    ignore();
  } while( true );
}

Assistant:

int main() {
    while (true) {
        uint8_t result = calculate();
        switch (result) {
            case 0:
                cout << "Execution completed";
                break;
            case 1:
                cout << "Syntax ERROR";
        }
        cout << endl;
        ::ignore();
    }
}